

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void ui_enter_world(game_event_type type,game_event_data *data,void *user)

{
  uint32_t *puVar1;
  player *p;
  
  p = player;
  smlcurs = false;
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x1e0000;
  redraw_stuff(p);
  event_add_handler_set(player_events,0xd,update_sidebar,(void *)0x0);
  event_add_handler_set(statusline_events,6,update_statusline,(void *)0x0);
  event_add_handler(EVENT_HP,hp_colour_change,(void *)0x0);
  event_add_handler(EVENT_MAP,update_maps,angband_term[0]);
  event_add_handler(EVENT_PLAYERMOVED,check_panel,(void *)0x0);
  event_add_handler(EVENT_SEEFLOOR,see_floor_items,(void *)0x0);
  event_add_handler(EVENT_ENTER_STORE,enter_store,(void *)0x0);
  event_add_handler(EVENT_EXPLOSION,display_explosion,(void *)0x0);
  event_add_handler(EVENT_BOLT,display_bolt,(void *)0x0);
  event_add_handler(EVENT_MISSILE,display_missile,(void *)0x0);
  event_add_handler(EVENT_CHECK_INTERRUPT,check_for_player_interrupt,(void *)0x0);
  event_add_handler(EVENT_REFRESH,refresh,(void *)0x0);
  event_add_handler(EVENT_NEW_LEVEL_DISPLAY,new_level_display_update,(void *)0x0);
  event_add_handler(EVENT_COMMAND_REPEAT,repeated_command_display,(void *)0x0);
  event_add_handler(EVENT_ANIMATE,animate,(void *)0x0);
  event_add_handler(EVENT_CHEAT_DEATH,cheat_death,(void *)0x0);
  screen_save_depth = screen_save_depth + -1;
  return;
}

Assistant:

static void ui_enter_world(game_event_type type, game_event_data *data,
						  void *user)
{
	/* Allow big cursor */
	smlcurs = false;

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP | PR_MONSTER | PR_MESSAGE);
	redraw_stuff(player);

	/* Because of the "flexible" sidebar, all these things trigger
	   the same function. */
	event_add_handler_set(player_events, N_ELEMENTS(player_events),
			      update_sidebar, NULL);

	/* The flexible statusbar has similar requirements, so is
	   also trigger by a large set of events. */
	event_add_handler_set(statusline_events, N_ELEMENTS(statusline_events),
			      update_statusline, NULL);

	/* Player HP can optionally change the colour of the '@' now. */
	event_add_handler(EVENT_HP, hp_colour_change, NULL);

	/* Simplest way to keep the map up to date - will do for now */
	event_add_handler(EVENT_MAP, update_maps, angband_term[0]);
#ifdef MAP_DEBUG
	event_add_handler(EVENT_MAP, trace_map_updates, angband_term[0]);
#endif

	/* Check if the panel should shift when the player's moved */
	event_add_handler(EVENT_PLAYERMOVED, check_panel, NULL);

	/* Take note of what's on the floor */
	event_add_handler(EVENT_SEEFLOOR, see_floor_items, NULL);

	/* Enter a store */
	event_add_handler(EVENT_ENTER_STORE, enter_store, NULL);

	/* Display an explosion */
	event_add_handler(EVENT_EXPLOSION, display_explosion, NULL);

	/* Display a bolt spell */
	event_add_handler(EVENT_BOLT, display_bolt, NULL);

	/* Display a physical missile */
	event_add_handler(EVENT_MISSILE, display_missile, NULL);

	/* Check to see if the player has tried to cancel game processing */
	event_add_handler(EVENT_CHECK_INTERRUPT, check_for_player_interrupt, NULL);

	/* Refresh the screen and put the cursor in the appropriate place */
	event_add_handler(EVENT_REFRESH, refresh, NULL);

	/* Do the visual updates required on a new dungeon level */
	event_add_handler(EVENT_NEW_LEVEL_DISPLAY, new_level_display_update, NULL);

	/* Automatically clear messages while the game is repeating commands */
	event_add_handler(EVENT_COMMAND_REPEAT, repeated_command_display, NULL);

	/* Do animations (e.g. monster colour changes) */
	event_add_handler(EVENT_ANIMATE, animate, NULL);

	/* Allow the player to cheat death, if appropriate */
	event_add_handler(EVENT_CHEAT_DEATH, cheat_death, NULL);

	/* Hack -- Decrease "icky" depth */
	screen_save_depth--;
}